

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<void_(*)(void_*)>::reallocate
          (QPodArrayOps<void_(*)(void_*)> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<void_(*)(void_*)>_*,_void_(**)(void_*)> pVar1;
  
  pVar1 = QTypedArrayData<void_(*)(void_*)>::reallocateUnaligned
                    ((this->super_QArrayDataPointer<void_(*)(void_*)>).d,
                     (this->super_QArrayDataPointer<void_(*)(void_*)>).ptr,alloc,option);
  if (pVar1.second != (_func_void_void_ptr **)0x0) {
    (this->super_QArrayDataPointer<void_(*)(void_*)>).d = pVar1.first;
    (this->super_QArrayDataPointer<void_(*)(void_*)>).ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }